

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsTextureTestUtil.cpp
# Opt level: O0

void __thiscall deqp::gls::TextureTestUtil::ProgramLibrary::clear(ProgramLibrary *this)

{
  ShaderProgram *this_00;
  bool bVar1;
  pointer ppVar2;
  _Self local_20;
  _Self local_18;
  iterator i;
  ProgramLibrary *this_local;
  
  i._M_node = (_Base_ptr)this;
  local_18._M_node =
       (_Base_ptr)
       std::
       map<deqp::gls::TextureTestUtil::Program,_glu::ShaderProgram_*,_std::less<deqp::gls::TextureTestUtil::Program>,_std::allocator<std::pair<const_deqp::gls::TextureTestUtil::Program,_glu::ShaderProgram_*>_>_>
       ::begin(&this->m_programs);
  while( true ) {
    local_20._M_node =
         (_Base_ptr)
         std::
         map<deqp::gls::TextureTestUtil::Program,_glu::ShaderProgram_*,_std::less<deqp::gls::TextureTestUtil::Program>,_std::allocator<std::pair<const_deqp::gls::TextureTestUtil::Program,_glu::ShaderProgram_*>_>_>
         ::end(&this->m_programs);
    bVar1 = std::operator!=(&local_18,&local_20);
    if (!bVar1) break;
    ppVar2 = std::
             _Rb_tree_iterator<std::pair<const_deqp::gls::TextureTestUtil::Program,_glu::ShaderProgram_*>_>
             ::operator->(&local_18);
    this_00 = ppVar2->second;
    if (this_00 != (ShaderProgram *)0x0) {
      glu::ShaderProgram::~ShaderProgram(this_00);
      operator_delete(this_00,0xd0);
    }
    ppVar2 = std::
             _Rb_tree_iterator<std::pair<const_deqp::gls::TextureTestUtil::Program,_glu::ShaderProgram_*>_>
             ::operator->(&local_18);
    ppVar2->second = (ShaderProgram *)0x0;
    std::
    _Rb_tree_iterator<std::pair<const_deqp::gls::TextureTestUtil::Program,_glu::ShaderProgram_*>_>::
    operator++(&local_18,0);
  }
  std::
  map<deqp::gls::TextureTestUtil::Program,_glu::ShaderProgram_*,_std::less<deqp::gls::TextureTestUtil::Program>,_std::allocator<std::pair<const_deqp::gls::TextureTestUtil::Program,_glu::ShaderProgram_*>_>_>
  ::clear(&this->m_programs);
  return;
}

Assistant:

void ProgramLibrary::clear (void)
{
	for (map<Program, glu::ShaderProgram*>::iterator i = m_programs.begin(); i != m_programs.end(); i++)
	{
		delete i->second;
		i->second = DE_NULL;
	}
	m_programs.clear();
}